

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int as154(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
         double *var,double *resid,double *loglik,double *hess,int cssml)

{
  size_t __size;
  double *__ptr;
  int iVar1;
  alik_object __ptr_00;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  long lVar5;
  reg_object obj;
  ulong uVar6;
  int p_00;
  int iVar7;
  undefined4 in_register_00000084;
  double *pdVar8;
  long lVar9;
  double dVar10;
  undefined1 local_b0 [8];
  custom_function as154_min;
  int P;
  int Q;
  int local_8c;
  undefined8 uStack_88;
  int q_local;
  double *local_80;
  double *local_78;
  ulong local_70;
  long local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  int *local_50;
  double local_48;
  uint local_3c;
  double *local_38;
  
  uStack_88 = CONCAT44(in_register_00000084,d);
  uVar6 = (ulong)(uint)q;
  piVar4 = (int *)(ulong)(uint)p;
  local_60 = N - d;
  local_8c = q;
  local_80 = (double *)malloc((long)local_60 << 3);
  iVar7 = (int)uStack_88;
  local_5c = N;
  local_58 = uVar6;
  local_50 = piVar4;
  local_3c = optmethod;
  local_38 = inp;
  if (cssml == 1) {
    css(inp,N,optmethod,p,iVar7,q,phi,theta,wmean,var,resid,loglik,hess);
    as154_min.params._0_4_ = 0;
    as154_min.params._4_4_ = 0;
    iVar1 = checkroots_cerr(phi,piVar4,theta,&local_8c,(double *)0x0,(int *)&as154_min.params,
                            (double *)0x0,(int *)((long)&as154_min.params + 4));
    if (iVar1 == 10) {
      return 10;
    }
    if (iVar1 == 0xc) {
      return 0xc;
    }
    local_48 = *wmean;
    pdVar8 = local_80;
    N = local_5c;
  }
  else {
    if (0 < p) {
      memset(phi,0,(long)piVar4 << 3);
    }
    pdVar8 = local_80;
    local_48 = 0.0;
    if (0 < (int)local_58) {
      memset(theta,0,(local_58 & 0xffffffff) << 3);
    }
  }
  if (iVar7 < 1) {
    if (0 < N) {
      memcpy(pdVar8,local_38,(ulong)(uint)N << 3);
    }
    iVar1 = (int)local_58;
    p_00 = (int)local_50;
    if ((-iVar1 == p_00 && iVar7 == 0) && cssml == 1) {
      free(pdVar8);
      return 1;
    }
    if (iVar7 == 0) {
      pdVar2 = (double *)malloc(8);
      pdVar3 = (double *)malloc((long)N << 3);
      obj = reg_init(N,1);
      setIntercept(obj,1);
      regress(obj,(double *)0x0,pdVar8,pdVar3,pdVar2,0.95);
      local_48 = obj->beta[0].value;
      free(pdVar2);
      free(pdVar3);
      free_reg(obj);
      __ptr_00 = alik_init((int)local_50,0,(int)local_58,N);
      goto LAB_001147da;
    }
  }
  else {
    N = diff(local_38,N,iVar7,pdVar8);
    iVar1 = (int)local_58;
    p_00 = (int)local_50;
  }
  __ptr_00 = alik_init(p_00,iVar7,iVar1,N);
LAB_001147da:
  local_70 = (ulong)(uint)N;
  __ptr_00->N = N;
  iVar7 = __ptr_00->pq;
  lVar9 = (long)iVar7;
  __size = lVar9 * 8;
  local_38 = (double *)malloc(__size);
  local_78 = (double *)malloc(__size);
  pdVar2 = (double *)malloc(__size * lVar9);
  pdVar3 = (double *)malloc(__size);
  piVar4 = (int *)malloc(lVar9 * 4);
  iVar1 = (int)local_50;
  if (0 < iVar1) {
    memcpy(local_38,phi,((ulong)local_50 & 0xffffffff) << 3);
    iVar1 = (int)local_50;
  }
  local_68 = (long)iVar1;
  if (0 < (int)local_58) {
    uVar6 = 0;
    do {
      local_38[local_68 + uVar6] = -theta[uVar6];
      uVar6 = uVar6 + 1;
    } while ((local_58 & 0xffffffff) != uVar6);
  }
  if (__ptr_00->M == 1) {
    local_38[(int)local_58 + iVar1] = local_48;
  }
  __ptr_00->mean = local_48;
  iVar1 = (int)local_70;
  if (0 < iVar1) {
    uVar6 = 0;
    do {
      dVar10 = pdVar8[uVar6];
      __ptr_00->x[(uint)(iVar1 * 2) + uVar6] = dVar10;
      __ptr_00->x[uVar6] = dVar10;
      uVar6 = uVar6 + 1;
    } while ((local_70 & 0xffffffff) != uVar6);
  }
  local_48 = (double)(long)iVar1;
  if (iVar1 < iVar1 * 2) {
    memset(__ptr_00->x + (long)local_48,0,(ulong)(iVar1 - 1) * 8 + 8);
  }
  local_b0 = (undefined1  [8])fas154;
  as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr_00;
  local_3c = fminunc((custom_function *)local_b0,(custom_gradient *)0x0,iVar7,local_38,1.0,local_3c,
                     local_78);
  pdVar8 = local_78;
  if ((0xf < local_3c) || ((0x8011U >> (local_3c & 0x1f) & 1) == 0)) {
    local_3c = 1;
  }
  if (0 < iVar7) {
    lVar5 = 0;
    do {
      pdVar3[lVar5] = 1.0;
      lVar5 = lVar5 + 1;
    } while (lVar9 != lVar5);
  }
  if (0 < (int)local_58) {
    invertroot((int)local_58,local_78 + local_68);
  }
  hessian_fd((custom_function *)local_b0,pdVar8,iVar7,pdVar3,__ptr_00->eps,hess);
  mtranspose(hess,iVar7,iVar7,pdVar2);
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      pdVar2[uVar6] = (hess[uVar6] + pdVar2[uVar6]) * (double)local_60 * 0.5;
      uVar6 = uVar6 + 1;
    } while (iVar7 * iVar7 + (uint)(iVar7 * iVar7 == 0) != uVar6);
  }
  ludecomp(pdVar2,iVar7,piVar4);
  minverse(pdVar2,iVar7,piVar4,hess);
  pdVar8 = local_78;
  iVar7 = (int)local_50;
  if (0 < iVar7) {
    memcpy(phi,local_78,((ulong)local_50 & 0xffffffff) << 3);
    iVar7 = (int)local_50;
  }
  __ptr = local_80;
  if (0 < (int)local_58) {
    uVar6 = 0;
    do {
      theta[uVar6] = -pdVar8[local_68 + uVar6];
      uVar6 = uVar6 + 1;
    } while ((local_58 & 0xffffffff) != uVar6);
  }
  dVar10 = 0.0;
  if (__ptr_00->M == 1) {
    dVar10 = pdVar8[(int)local_58 + iVar7];
  }
  *wmean = dVar10;
  *var = __ptr_00->ssq / (double)(int)local_70;
  if (0 < local_60) {
    memcpy(resid,__ptr_00->x + (long)local_48,(ulong)(~(uint)uStack_88 + local_5c) * 8 + 8);
  }
  *loglik = __ptr_00->loglik;
  free(local_38);
  free(pdVar8);
  free(__ptr);
  free(pdVar2);
  free(piVar4);
  free(pdVar3);
  free(__ptr_00);
  return local_3c;
}

Assistant:

int as154(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,
	double *resid,double *loglik,double *hess, int cssml) {
	int i,pq,retval,length,ret,rp,P,Q,ERR;
	double *b,*tf,*x,*dx,*thess,*varcovar,*res;
	int *ipiv;
	double maxstep,sigma,coeff;
	alik_object obj;
	reg_object fit;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;
	
	maxstep = 1.0;

	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);
		P = 0;
		Q = 0;

		ERR = checkroots_cerr(phi, &p, theta, &q, NULL, &P, NULL, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
	}


	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	if (p + q == 0 && d == 0 && cssml == 1) {
		free(x);
		//free_alik(obj);
		return 1;
	}

	if (d == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_init(p, d, q, N);

	obj->N = N;
	
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = coeff;
	}

	obj->mean = coeff;


	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as154_min = { fas154, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length-d) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
		wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) N;
	for (i = 0; i < length - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free_alik(obj);
	return ret;
}